

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::GetKnightMoves<true>(Node *this,Color color,int from,int depth)

{
  int iVar1;
  uint to_00;
  uint pc;
  bool bVar2;
  int cap;
  int to;
  uint64_t mvs;
  int local_20;
  int score;
  int kdir;
  int depth_local;
  int from_local;
  Color color_local;
  Node *this_local;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x685,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x686,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[from] == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x687,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if (*(byte *)(&_board)[from] != (color | 4U)) {
    __assert_fail("_board[from]->type == (color|Knight)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x688,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((uint)*(byte *)((&_board)[from] + 1) != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x689,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  iVar1 = GetPinDir(this,color,from);
  if (iVar1 == 0) {
    local_20 = 0;
    if (depth == 0) {
      local_20 = GetDiscoverDir(this,color,from);
    }
    for (_cap = *(ulong *)(_knightMoves + (long)from * 8); _cap != 0; _cap = _cap >> 8) {
      if ((_cap & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x695,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      to_00 = ((uint)_cap & 0xff) - 1;
      if ((to_00 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x697,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      if (to_00 == from) {
        __assert_fail("to != from",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x698,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      pc = (uint)*(byte *)(&_board)[(int)to_00];
      bVar2 = true;
      if (pc == 0) {
        bVar2 = (undefined *)(&_board)[(int)to_00] == _EMPTY;
      }
      if (!bVar2) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x69a,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      if (pc == 0) {
        if ((depth == 0) &&
           (iVar1 = IsKnightMove((uint)(byte)(&_KING)[(color ^ 0xffU) & 1][1],to_00),
           local_20 != 0 || iVar1 != 0)) {
          AddMove(this,KnightMove,from,to_00,
                  (*(int *)(_SQR + (long)(int)to_00 * 4) - *(int *)(_SQR + (long)from * 4)) + 0x14,0
                  ,0);
        }
      }
      else if (((*(byte *)(&_board)[(int)to_00] & 1) != 0) != color) {
        iVar1 = ValueOf(pc);
        AddMove(this,KnightMove,from,to_00,
                ((iVar1 + *(int *)(_SQR + (long)(int)to_00 * 4)) - *(int *)(_SQR + (long)from * 4))
                + -0x20,pc,0);
      }
    }
  }
  return;
}

Assistant:

void GetKnightMoves(const Color color, const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Knight));
    assert(_board[from]->sqr == from);
    if (GetPinDir(color, from)) {
      return;
    }

    int kdir = 0;
    if (qsearch && !depth) {
      kdir = GetDiscoverDir(color, from);
    }

    int score;
    for (uint64_t mvs = _knightMoves[from]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int to = ((mvs & 0xFF) - 1);
      assert(IS_SQUARE(to));
      assert(to != from);
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if (qsearch) {
          if (!depth && (kdir | IsKnightMove(_KING[!color]->sqr, to))) {
            score = (_SQR[to] - _SQR[from] + 20);
            AddMove(KnightMove, from, to, score);
          }
        }
        else {
          score = (_SQR[to] - _SQR[from]);
          AddMove(KnightMove, from, to, score);
        }
      }
      else if (COLOR(cap) != color) {
        score = (ValueOf(cap) + _SQR[to] - _SQR[from] - (8 * KnightMove));
        AddMove(KnightMove, from, to, score, cap);
      }
    }
  }